

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusIntersect.cpp
# Opt level: O2

bool ParseLocusIntersect(string *sLine1,string *sLine2,string *sLine3)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  LLPoint intersection;
  string sPtIntLon;
  string sIntersection1Lat;
  string sPtIntLat;
  string sTestId;
  string sIntersection1Long;
  double local_610;
  Locus locus1;
  string sLocus2EndDist;
  string sLocus2StartDist;
  string sLocus2EndLong;
  string sLocus2EndLat;
  string sLocus2StartLong;
  string sLocus2StartLat;
  string sLocus2GeoEndLong;
  string sLocus2GeoEndLat;
  string sLocus2GeoStartLong;
  string sLocus2GeoStartLat;
  string sLocus1EndDist;
  string sLocus1StartDist;
  string sLocus1EndLong;
  string sLocus1EndLat;
  string sLocus1StartLong;
  string sLocus1StartLat;
  string sLocus1GeoEndLong;
  string sLocus1GeoEndLat;
  string sLocus1GeoStartLong;
  string sLocus1GeoStartLat;
  Locus locus2;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  sLocus1GeoStartLat._M_dataplus._M_p = (pointer)&sLocus1GeoStartLat.field_2;
  sLocus1GeoStartLat._M_string_length = 0;
  sLocus1GeoStartLong._M_dataplus._M_p = (pointer)&sLocus1GeoStartLong.field_2;
  sLocus1GeoStartLong._M_string_length = 0;
  sLocus1GeoStartLat.field_2._M_local_buf[0] = '\0';
  sLocus1GeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocus1GeoEndLat._M_dataplus._M_p = (pointer)&sLocus1GeoEndLat.field_2;
  sLocus1GeoEndLat._M_string_length = 0;
  sLocus1GeoEndLong._M_dataplus._M_p = (pointer)&sLocus1GeoEndLong.field_2;
  sLocus1GeoEndLong._M_string_length = 0;
  sLocus1GeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocus1GeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocus1StartLat._M_dataplus._M_p = (pointer)&sLocus1StartLat.field_2;
  sLocus1StartLat._M_string_length = 0;
  sLocus1StartLong._M_dataplus._M_p = (pointer)&sLocus1StartLong.field_2;
  sLocus1StartLong._M_string_length = 0;
  sLocus1StartLat.field_2._M_local_buf[0] = '\0';
  sLocus1StartLong.field_2._M_local_buf[0] = '\0';
  sLocus1EndLat._M_dataplus._M_p = (pointer)&sLocus1EndLat.field_2;
  sLocus1EndLat._M_string_length = 0;
  sLocus1EndLong._M_dataplus._M_p = (pointer)&sLocus1EndLong.field_2;
  sLocus1EndLong._M_string_length = 0;
  sLocus1EndLat.field_2._M_local_buf[0] = '\0';
  sLocus1EndLong.field_2._M_local_buf[0] = '\0';
  sLocus1StartDist._M_dataplus._M_p = (pointer)&sLocus1StartDist.field_2;
  sLocus1StartDist._M_string_length = 0;
  sLocus1EndDist._M_dataplus._M_p = (pointer)&sLocus1EndDist.field_2;
  sLocus1EndDist._M_string_length = 0;
  sLocus1StartDist.field_2._M_local_buf[0] = '\0';
  sLocus1EndDist.field_2._M_local_buf[0] = '\0';
  sLocus2GeoStartLat._M_dataplus._M_p = (pointer)&sLocus2GeoStartLat.field_2;
  sLocus2GeoStartLat._M_string_length = 0;
  sLocus2GeoStartLong._M_dataplus._M_p = (pointer)&sLocus2GeoStartLong.field_2;
  sLocus2GeoStartLong._M_string_length = 0;
  sLocus2GeoStartLat.field_2._M_local_buf[0] = '\0';
  sLocus2GeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocus2GeoEndLat._M_dataplus._M_p = (pointer)&sLocus2GeoEndLat.field_2;
  sLocus2GeoEndLat._M_string_length = 0;
  sLocus2GeoEndLong._M_dataplus._M_p = (pointer)&sLocus2GeoEndLong.field_2;
  sLocus2GeoEndLong._M_string_length = 0;
  sLocus2GeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocus2GeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocus2StartLat._M_dataplus._M_p = (pointer)&sLocus2StartLat.field_2;
  sLocus2StartLat._M_string_length = 0;
  sLocus2StartLong._M_dataplus._M_p = (pointer)&sLocus2StartLong.field_2;
  sLocus2StartLong._M_string_length = 0;
  sLocus2StartLat.field_2._M_local_buf[0] = '\0';
  sLocus2StartLong.field_2._M_local_buf[0] = '\0';
  sLocus2EndLat._M_dataplus._M_p = (pointer)&sLocus2EndLat.field_2;
  sLocus2EndLat._M_string_length = 0;
  sLocus2EndLong._M_dataplus._M_p = (pointer)&sLocus2EndLong.field_2;
  sLocus2EndLong._M_string_length = 0;
  sLocus2EndLat.field_2._M_local_buf[0] = '\0';
  sLocus2EndLong.field_2._M_local_buf[0] = '\0';
  sLocus2StartDist._M_dataplus._M_p = (pointer)&sLocus2StartDist.field_2;
  sLocus2StartDist._M_string_length = 0;
  sLocus2EndDist._M_dataplus._M_p = (pointer)&sLocus2EndDist.field_2;
  sLocus2EndDist._M_string_length = 0;
  sLocus2StartDist.field_2._M_local_buf[0] = '\0';
  sLocus2EndDist.field_2._M_local_buf[0] = '\0';
  sIntersection1Lat._M_dataplus._M_p = (pointer)&sIntersection1Lat.field_2;
  sIntersection1Lat._M_string_length = 0;
  sIntersection1Long._M_dataplus._M_p = (pointer)&sIntersection1Long.field_2;
  sIntersection1Long._M_string_length = 0;
  sIntersection1Lat.field_2._M_local_buf[0] = '\0';
  sIntersection1Long.field_2._M_local_buf[0] = '\0';
  sTestId._M_dataplus._M_p = (pointer)&sTestId.field_2;
  sTestId._M_string_length = 0;
  sTestId.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_50,(string *)sLine1);
  bVar1 = ParseLocusIntersect1
                    (&local_50,&sTestId,&sLocus1GeoStartLat,&sLocus1GeoStartLong,&sLocus1GeoEndLat,
                     &sLocus1GeoEndLong,&sLocus1StartLat,&sLocus1StartLong,&sLocus1EndLat,
                     &sLocus1EndLong,&sLocus1StartDist,&sLocus1EndDist);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,(string *)sLine2);
    bVar1 = ParseLocusIntersect2
                      (&local_70,&sLocus2GeoStartLat,&sLocus2GeoStartLong,&sLocus2GeoEndLat,
                       &sLocus2GeoEndLong,&sLocus2StartLat,&sLocus2StartLong,&sLocus2EndLat,
                       &sLocus2EndLong,&sLocus2StartDist,&sLocus2EndDist);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_90,(string *)sLine3);
      bVar1 = ParseLocusIntersect3(&local_90,&sIntersection1Lat,&sIntersection1Long);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar1) {
        locus1.startDist = 0.0;
        locus1.endDist = 0.0;
        locus1.locusEnd.latitude = 0.0;
        locus1.locusEnd.longitude = 0.0;
        locus1.locusStart.latitude = 0.0;
        locus1.locusStart.longitude = 0.0;
        locus1.geoEnd.latitude = 0.0;
        locus1.geoEnd.longitude = 0.0;
        locus1.geoStart.latitude = 0.0;
        locus1.geoStart.longitude = 0.0;
        locus1.lineType = 0;
        locus2.startDist = 0.0;
        locus2.endDist = 0.0;
        locus2.locusEnd.latitude = 0.0;
        locus2.locusEnd.longitude = 0.0;
        locus2.locusStart.latitude = 0.0;
        locus2.locusStart.longitude = 0.0;
        locus2.geoEnd.latitude = 0.0;
        locus2.geoEnd.longitude = 0.0;
        locus2.geoStart.latitude = 0.0;
        locus2.geoStart.longitude = 0.0;
        locus2.lineType = 0;
        std::__cxx11::string::string((string *)&local_b0,(string *)&sLocus1GeoStartLat);
        dVar4 = ParseLatitude(&local_b0);
        std::__cxx11::string::string((string *)&local_d0,(string *)&sLocus1GeoStartLong);
        dVar5 = ParseLongitude(&local_d0);
        locus1.geoStart.latitude = dVar4 * 0.017453292519943295;
        locus1.geoStart.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::string((string *)&local_f0,(string *)&sLocus1GeoEndLat);
        dVar4 = ParseLatitude(&local_f0);
        std::__cxx11::string::string((string *)&local_110,(string *)&sLocus1GeoEndLong);
        dVar5 = ParseLongitude(&local_110);
        locus1.geoEnd.latitude = dVar4 * 0.017453292519943295;
        locus1.geoEnd.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::string((string *)&local_130,(string *)&sLocus1StartLat);
        dVar4 = ParseLatitude(&local_130);
        std::__cxx11::string::string((string *)&local_150,(string *)&sLocus1StartLong);
        dVar5 = ParseLongitude(&local_150);
        locus1.locusStart.latitude = dVar4 * 0.017453292519943295;
        locus1.locusStart.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::string((string *)&local_170,(string *)&sLocus1EndLat);
        dVar4 = ParseLatitude(&local_170);
        std::__cxx11::string::string((string *)&local_190,(string *)&sLocus1EndLong);
        dVar5 = ParseLongitude(&local_190);
        locus1.locusEnd.latitude = dVar4 * 0.017453292519943295;
        locus1.locusEnd.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_170);
        dVar4 = atof(sLocus1StartDist._M_dataplus._M_p);
        locus1.startDist = dVar4 * 1852.0;
        dVar4 = atof(sLocus1EndDist._M_dataplus._M_p);
        locus1.endDist = dVar4 * 1852.0;
        locus1.lineType = 0;
        std::__cxx11::string::string((string *)&local_1b0,(string *)&sLocus2GeoStartLat);
        dVar4 = ParseLatitude(&local_1b0);
        std::__cxx11::string::string((string *)&local_1d0,(string *)&sLocus2GeoStartLong);
        dVar5 = ParseLongitude(&local_1d0);
        locus2.geoStart.latitude = dVar4 * 0.017453292519943295;
        locus2.geoStart.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::string((string *)&local_1f0,(string *)&sLocus2GeoEndLat);
        dVar4 = ParseLatitude(&local_1f0);
        std::__cxx11::string::string((string *)&local_210,(string *)&sLocus2GeoEndLong);
        dVar5 = ParseLongitude(&local_210);
        locus2.geoEnd.latitude = dVar4 * 0.017453292519943295;
        locus2.geoEnd.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::string((string *)&local_230,(string *)&sLocus2StartLat);
        dVar4 = ParseLatitude(&local_230);
        std::__cxx11::string::string((string *)&local_250,(string *)&sLocus2StartLong);
        dVar5 = ParseLongitude(&local_250);
        locus2.locusStart.latitude = dVar4 * 0.017453292519943295;
        locus2.locusStart.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::string((string *)&local_270,(string *)&sLocus2EndLat);
        dVar4 = ParseLatitude(&local_270);
        std::__cxx11::string::string((string *)&local_290,(string *)&sLocus2EndLong);
        dVar5 = ParseLongitude(&local_290);
        locus2.locusEnd.latitude = dVar4 * 0.017453292519943295;
        locus2.locusEnd.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_270);
        dVar4 = atof(sLocus2StartDist._M_dataplus._M_p);
        locus2.startDist = dVar4 * 1852.0;
        dVar4 = atof(sLocus2EndDist._M_dataplus._M_p);
        locus2.endDist = dVar4 * 1852.0;
        locus2.lineType = 0;
        intersection.latitude = 0.0;
        intersection.longitude = 0.0;
        iVar2 = GeoCalcs::LocusIntersect(&locus1,&locus2,&intersection,1e-09,5e-16);
        if (iVar2 != 0) {
          sPtIntLon._M_dataplus._M_p = (pointer)(intersection.latitude * 57.29577951308232);
          ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
          local_610 = intersection.longitude * 57.29577951308232;
          ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,&local_610);
          iVar2 = std::__cxx11::string::compare((string *)&sPtIntLat);
          bVar1 = true;
          if (iVar2 != 0) {
            std::__cxx11::string::string((string *)&local_2b0,(string *)&sIntersection1Lat);
            dVar5 = ParseLatitude(&local_2b0);
            std::__cxx11::string::~string((string *)&local_2b0);
            dVar6 = ABS(dVar5 * 0.017453292519943295);
            dVar4 = ABS(intersection.latitude);
            if (dVar6 <= ABS(intersection.latitude)) {
              dVar4 = dVar6;
            }
            if (ABS(dVar5 * 0.017453292519943295 - intersection.latitude) <= dVar4 * 1e-10) {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3,
                                       " within rounding tolerance of 1e-10: Intersect 1 Latitude: "
                                      );
              poVar3 = std::operator<<(poVar3,(string *)&sIntersection1Lat);
              poVar3 = std::operator<<(poVar3," calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLat);
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3," failed: Expected Intersect 1 latitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sIntersection1Lat);
              poVar3 = std::operator<<(poVar3,"  calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLat);
              bVar1 = false;
            }
          }
          iVar2 = std::__cxx11::string::compare((string *)&sPtIntLon);
          if (iVar2 != 0) {
            std::__cxx11::string::string((string *)&local_2d0,(string *)&sIntersection1Long);
            dVar5 = ParseLongitude(&local_2d0);
            std::__cxx11::string::~string((string *)&local_2d0);
            dVar6 = ABS(dVar5 * 0.017453292519943295);
            dVar4 = ABS(intersection.longitude);
            if (dVar6 <= ABS(intersection.longitude)) {
              dVar4 = dVar6;
            }
            if (ABS(dVar5 * 0.017453292519943295 - intersection.longitude) <= dVar4 * 1e-10) {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3,
                                       " within rounding tolerance of 1e-10: Intersect 1 Longitude: "
                                      );
              poVar3 = std::operator<<(poVar3,(string *)&sIntersection1Long);
              poVar3 = std::operator<<(poVar3," calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLon);
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3," failed: Expected Intersect 1 longitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sIntersection1Long);
              poVar3 = std::operator<<(poVar3,"  calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLon);
              bVar1 = false;
            }
          }
          std::__cxx11::string::~string((string *)&sPtIntLon);
          std::__cxx11::string::~string((string *)&sPtIntLat);
          goto LAB_001420d9;
        }
        iVar2 = std::__cxx11::string::compare((char *)&sIntersection1Lat);
        if (iVar2 == 0) {
          bVar1 = true;
          goto LAB_001420d9;
        }
        sPtIntLon._M_dataplus._M_p = (pointer)(intersection.latitude * 57.29577951308232);
        ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
        local_610 = intersection.longitude * 57.29577951308232;
        ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,&local_610);
        poVar3 = std::operator<<((ostream *)&std::cout,"\n");
        poVar3 = std::operator<<(poVar3,(string *)&sTestId);
        poVar3 = std::operator<<(poVar3,"failed: Expected solution of: ");
        poVar3 = std::operator<<(poVar3,(string *)&sIntersection1Lat);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = std::operator<<(poVar3,(string *)&sIntersection1Long);
        std::operator<<(poVar3," but none was found");
        std::__cxx11::string::~string((string *)&sPtIntLon);
        std::__cxx11::string::~string((string *)&sPtIntLat);
      }
    }
  }
  bVar1 = false;
LAB_001420d9:
  std::__cxx11::string::~string((string *)&sTestId);
  std::__cxx11::string::~string((string *)&sIntersection1Long);
  std::__cxx11::string::~string((string *)&sIntersection1Lat);
  std::__cxx11::string::~string((string *)&sLocus2EndDist);
  std::__cxx11::string::~string((string *)&sLocus2StartDist);
  std::__cxx11::string::~string((string *)&sLocus2EndLong);
  std::__cxx11::string::~string((string *)&sLocus2EndLat);
  std::__cxx11::string::~string((string *)&sLocus2StartLong);
  std::__cxx11::string::~string((string *)&sLocus2StartLat);
  std::__cxx11::string::~string((string *)&sLocus2GeoEndLong);
  std::__cxx11::string::~string((string *)&sLocus2GeoEndLat);
  std::__cxx11::string::~string((string *)&sLocus2GeoStartLong);
  std::__cxx11::string::~string((string *)&sLocus2GeoStartLat);
  std::__cxx11::string::~string((string *)&sLocus1EndDist);
  std::__cxx11::string::~string((string *)&sLocus1StartDist);
  std::__cxx11::string::~string((string *)&sLocus1EndLong);
  std::__cxx11::string::~string((string *)&sLocus1EndLat);
  std::__cxx11::string::~string((string *)&sLocus1StartLong);
  std::__cxx11::string::~string((string *)&sLocus1StartLat);
  std::__cxx11::string::~string((string *)&sLocus1GeoEndLong);
  std::__cxx11::string::~string((string *)&sLocus1GeoEndLat);
  std::__cxx11::string::~string((string *)&sLocus1GeoStartLong);
  std::__cxx11::string::~string((string *)&sLocus1GeoStartLat);
  return bVar1;
}

Assistant:

bool ParseLocusIntersect(string sLine1, string sLine2, string sLine3)
{
    bool bPassed = true;

    string sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat, sLocus1GeoEndLong;
    string sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong;
    string sLocus1StartDist, sLocus1EndDist;

    string sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat, sLocus2GeoEndLong;
    string sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong;
    string sLocus2StartDist, sLocus2EndDist;

    string sIntersection1Lat, sIntersection1Long;
    string sTestId;

    if (!ParseLocusIntersect1(sLine1, sTestId, sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat,
                              sLocus1GeoEndLong,
                              sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong, sLocus1StartDist,
                              sLocus1EndDist))
        return false;

    if (!ParseLocusIntersect2(sLine2, sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat, sLocus2GeoEndLong,
                              sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong, sLocus2StartDist,
                              sLocus2EndDist))
        return false;

    if (!ParseLocusIntersect3(sLine3, sIntersection1Lat, sIntersection1Long))
        return false;

    Locus locus1, locus2;
    locus1.geoStart.Set(Deg2Rad(ParseLatitude(sLocus1GeoStartLat)), Deg2Rad(ParseLongitude(sLocus1GeoStartLong)));
    locus1.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus1GeoEndLat)), Deg2Rad(ParseLongitude(sLocus1GeoEndLong)));
    locus1.locusStart.Set(Deg2Rad(ParseLatitude(sLocus1StartLat)), Deg2Rad(ParseLongitude(sLocus1StartLong)));
    locus1.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus1EndLat)), Deg2Rad(ParseLongitude(sLocus1EndLong)));
    locus1.startDist = NmToMeters(atof(sLocus1StartDist.c_str()));
    locus1.endDist = NmToMeters(atof(sLocus1EndDist.c_str()));
    locus1.lineType = 0;

    locus2.geoStart.Set(Deg2Rad(ParseLatitude(sLocus2GeoStartLat)), Deg2Rad(ParseLongitude(sLocus2GeoStartLong)));
    locus2.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus2GeoEndLat)), Deg2Rad(ParseLongitude(sLocus2GeoEndLong)));
    locus2.locusStart.Set(Deg2Rad(ParseLatitude(sLocus2StartLat)), Deg2Rad(ParseLongitude(sLocus2StartLong)));
    locus2.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus2EndLat)), Deg2Rad(ParseLongitude(sLocus2EndLong)));
    locus2.startDist = NmToMeters(atof(sLocus2StartDist.c_str()));
    locus2.endDist = NmToMeters(atof(sLocus2EndDist.c_str()));
    locus2.lineType = 0;

    LLPoint intersection;

    int nVal = LocusIntersect(locus1, locus2, intersection, kTol, kEps);

    if (nVal == 0)
    {
        if (sIntersection1Lat.compare("N/A") != 0)
        {
            string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
            string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
            cout << "\n" << sTestId << "failed: Expected solution of: " << sIntersection1Lat << " " <<
            sIntersection1Long << " but none was found";
            bPassed = false;
        }
    }
    else
    {
        string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
        string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
        if (sPtIntLat.compare(sIntersection1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sIntersection1Lat));
            if (IsApprox(dLat, intersection.latitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect 1 Latitude: " <<
                sIntersection1Lat << " calced: " << sPtIntLat;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Intersect 1 latitude: " << sIntersection1Lat <<
                "  calced: " << sPtIntLat;
                bPassed = false;
            }
        }
        if (sPtIntLon.compare(sIntersection1Long) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sIntersection1Long));
            if (IsApprox(dLon, intersection.longitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect 1 Longitude: " <<
                sIntersection1Long << " calced: " << sPtIntLon;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Intersect 1 longitude: " << sIntersection1Long <<
                "  calced: " << sPtIntLon;
                bPassed = false;
            }
        }
    }
    return bPassed;
}